

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O2

bool __thiscall
dielectric::scatter(dielectric *this,ray *r_in,hit_record *rec,color *attenuation,ray *scattered)

{
  double dVar1;
  double dVar2;
  double dVar3;
  vec3 unit_direction;
  double local_a0;
  vec3 local_88;
  double local_70;
  vec3 local_38;
  
  attenuation->e[0] = 1.0;
  attenuation->e[1] = 1.0;
  attenuation->e[2] = 1.0;
  local_a0 = this->refraction_index;
  if (rec->front_face != false) {
    local_a0 = 1.0 / local_a0;
  }
  unit_vector(&local_38,&r_in->dir);
  dVar2 = (-local_38.e[0] * (rec->normal).e[0] - (rec->normal).e[1] * local_38.e[1]) -
          local_38.e[2] * (rec->normal).e[2];
  if (1.0 <= dVar2) {
    dVar2 = 1.0;
  }
  dVar1 = 1.0 - dVar2 * dVar2;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  local_88.e[2] = 0.0;
  local_88.e[0] = 0.0;
  local_88.e[1] = 0.0;
  if (dVar1 * local_a0 <= 1.0) {
    dVar3 = (1.0 - local_a0) / (local_a0 + 1.0);
    dVar3 = dVar3 * dVar3;
    local_70 = 1.0 - dVar3;
    dVar2 = pow(1.0 - dVar2,5.0);
    dVar2 = dVar2 * local_70;
    dVar1 = random_double();
    if (dVar2 + dVar3 <= dVar1) {
      refract(&local_88,&local_38,&rec->normal,local_a0);
      goto LAB_00114ce0;
    }
  }
  reflect(&local_88,&local_38,&rec->normal);
LAB_00114ce0:
  dVar2 = r_in->tm;
  dVar1 = (rec->p).e[2];
  dVar3 = (rec->p).e[1];
  (scattered->orig).e[0] = (rec->p).e[0];
  (scattered->orig).e[1] = dVar3;
  (scattered->dir).e[1] = local_88.e[1];
  (scattered->dir).e[2] = local_88.e[2];
  (scattered->orig).e[2] = dVar1;
  (scattered->dir).e[0] = local_88.e[0];
  scattered->tm = dVar2;
  return true;
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, color& attenuation, ray& scattered)
    const override {
        attenuation = color(1.0, 1.0, 1.0);
        double ri = rec.front_face ? (1.0/refraction_index) : refraction_index;

        vec3 unit_direction = unit_vector(r_in.direction());
        double cos_theta = std::fmin(dot(-unit_direction, rec.normal), 1.0);
        double sin_theta = std::sqrt(1.0 - cos_theta*cos_theta);

        bool cannot_refract = ri * sin_theta > 1.0;
        vec3 direction;

        if (cannot_refract || reflectance(cos_theta, ri) > random_double())
            direction = reflect(unit_direction, rec.normal);
        else
            direction = refract(unit_direction, rec.normal, ri);

        scattered = ray(rec.p, direction, r_in.time());
        return true;
    }